

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_module.cpp
# Opt level: O3

void __thiscall
dxil_spv::SPIRVModule::Impl::emit_entry_point
          (Impl *this,ExecutionModel model,char *name,bool physical_storage)

{
  Builder *this_00;
  Set<spv::Capability> *this_01;
  Function *function;
  Instruction *pIVar1;
  undefined7 in_register_00000009;
  Capability local_34;
  
  this->execution_model = model;
  this_00 = &this->builder;
  this_01 = &(this->builder).capabilities;
  std::
  _Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,dxil_spv::ThreadLocalAllocator<spv::Capability>>
  ::_M_insert_unique<spv::Capability_const&>
            ((_Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,dxil_spv::ThreadLocalAllocator<spv::Capability>>
              *)this_01,&local_34);
  if ((int)CONCAT71(in_register_00000009,physical_storage) == 0) {
    (this->builder).addressModel = AddressingModelLogical;
    (this->builder).memoryModel = MemoryModelGLSL450;
  }
  else {
    (this->builder).addressModel = AddressingModelPhysicalStorageBuffer64;
    (this->builder).memoryModel = MemoryModelGLSL450;
    std::
    _Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,dxil_spv::ThreadLocalAllocator<spv::Capability>>
    ::_M_insert_unique<spv::Capability_const&>
              ((_Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,dxil_spv::ThreadLocalAllocator<spv::Capability>>
                *)this_01,&local_34);
    spv::Builder::addExtension(this_00,"SPV_KHR_physical_storage_buffer");
  }
  function = spv::Builder::makeEntryPoint(this_00,"main");
  this->entry_function = function;
  pIVar1 = spv::Builder::addEntryPoint(this_00,model,function,name);
  this->entry_point = pIVar1;
  if (model == ExecutionModelFragment) {
    spv::Builder::addExecutionMode
              (this_00,this->entry_function,ExecutionModeOriginUpperLeft,-1,-1,-1);
  }
  if ((this->instruction_instrumentation).info.enabled == true) {
    spv::Builder::addExtension(this_00,"SPV_KHR_float_controls");
    std::
    _Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,dxil_spv::ThreadLocalAllocator<spv::Capability>>
    ::_M_insert_unique<spv::Capability_const&>
              ((_Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,dxil_spv::ThreadLocalAllocator<spv::Capability>>
                *)this_01,&local_34);
    if ((this->instruction_instrumentation).info.fp16 == true) {
      std::
      _Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,dxil_spv::ThreadLocalAllocator<spv::Capability>>
      ::_M_insert_unique<spv::Capability_const&>
                ((_Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,dxil_spv::ThreadLocalAllocator<spv::Capability>>
                  *)this_01,&local_34);
      spv::Builder::addExecutionMode
                (this_00,this->entry_function,ExecutionModeSignedZeroInfNanPreserve,0x10,-1,-1);
    }
    if ((this->instruction_instrumentation).info.fp32 == true) {
      spv::Builder::addExecutionMode
                (this_00,this->entry_function,ExecutionModeSignedZeroInfNanPreserve,0x20,-1,-1);
    }
    if ((this->instruction_instrumentation).info.fp64 == true) {
      spv::Builder::addExecutionMode
                (this_00,this->entry_function,ExecutionModeSignedZeroInfNanPreserve,0x40,-1,-1);
    }
  }
  return;
}

Assistant:

void SPIRVModule::Impl::emit_entry_point(spv::ExecutionModel model, const char *name, bool physical_storage)
{
	execution_model = model;
	builder.addCapability(spv::Capability::CapabilityShader);

	if (physical_storage)
	{
		builder.setMemoryModel(spv::AddressingModel::AddressingModelPhysicalStorageBuffer64, spv::MemoryModelGLSL450);
		builder.addCapability(spv::CapabilityPhysicalStorageBufferAddresses);
		builder.addExtension("SPV_KHR_physical_storage_buffer");
	}
	else
		builder.setMemoryModel(spv::AddressingModel::AddressingModelLogical, spv::MemoryModel::MemoryModelGLSL450);

	entry_function = builder.makeEntryPoint("main");
	entry_point = builder.addEntryPoint(model, entry_function, name);
	if (model == spv::ExecutionModel::ExecutionModelFragment)
		builder.addExecutionMode(entry_function, spv::ExecutionModeOriginUpperLeft);

	if (instruction_instrumentation.info.enabled)
	{
		builder.addExtension("SPV_KHR_float_controls");
		builder.addCapability(spv::CapabilitySignedZeroInfNanPreserve);

		if (instruction_instrumentation.info.fp16)
		{
			builder.addCapability(spv::CapabilityFloat16);
			builder.addExecutionMode(entry_function, spv::ExecutionModeSignedZeroInfNanPreserve, 16);
		}

		if (instruction_instrumentation.info.fp32)
			builder.addExecutionMode(entry_function, spv::ExecutionModeSignedZeroInfNanPreserve, 32);

		if (instruction_instrumentation.info.fp64)
			builder.addExecutionMode(entry_function, spv::ExecutionModeSignedZeroInfNanPreserve, 64);
	}
}